

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  float *in_RSI;
  ImVec2 *in_RDI;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float in_XMM1_Da;
  float in_XMM2_Da;
  int arc_segment_count;
  int circle_segment_count;
  float arc_length;
  bool a_emit_end;
  bool a_emit_start;
  float a_max_segment_angle;
  float a_min_segment_angle;
  int a_mid_samples;
  int a_max_sample;
  int a_min_sample;
  float a_max_sample_f;
  float a_min_sample_f;
  bool a_is_reverse;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  ImDrawList *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  int iVar10;
  float in_stack_ffffffffffffff94;
  int iVar11;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  undefined6 in_stack_ffffffffffffffb8;
  byte bVar12;
  byte bVar13;
  
  if (0.5 <= in_XMM0_Da) {
    if (in_EDX < 1) {
      if (*(float *)((long)in_RDI[7] + 0x1c8) < in_XMM0_Da) {
        fVar4 = ImAbs(in_XMM2_Da - in_XMM1_Da);
        iVar3 = _CalcCircleAutoSegmentCount(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
        fVar5 = ceilf(((float)iVar3 * fVar4) / 6.2831855);
        iVar11 = ImMax<int>((int)fVar5,(int)(6.2831855 / fVar4));
        _PathArcToN((ImDrawList *)CONCAT44(iVar3,iVar11),in_RDI,in_stack_ffffffffffffff94,
                    in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      }
      else {
        bVar1 = in_XMM1_Da <= in_XMM2_Da;
        fVar4 = (in_XMM1_Da * 48.0) / 6.2831855;
        fVar5 = (in_XMM2_Da * 48.0) / 6.2831855;
        if (bVar1) {
          fVar4 = ceilf(fVar4);
          iVar3 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
        }
        else {
          fVar4 = ImFloor(fVar4);
          iVar3 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
        }
        iVar11 = (int)fVar4;
        if (bVar1) {
          fVar4 = ImFloor(fVar5);
        }
        else {
          fVar4 = ceilf(fVar5);
        }
        iVar10 = (int)fVar4;
        if (bVar1) {
          iVar2 = ImMax<int>(iVar10 - iVar11,0);
        }
        else {
          iVar2 = ImMax<int>(iVar11 - iVar10,0);
        }
        fVar4 = ((float)iVar11 * 3.1415927 * 2.0) / 48.0;
        fVar5 = ((float)iVar10 * 3.1415927 * 2.0) / 48.0;
        fVar6 = ImAbs(fVar4 - in_XMM1_Da);
        bVar13 = 1e-05 <= fVar6;
        fVar6 = ImAbs(in_XMM2_Da - fVar5);
        bVar12 = 1e-05 <= fVar6;
        ImVector<ImVec2>::reserve
                  ((ImVector<ImVec2> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                   ,iVar3);
        if ((bVar13 & 1) != 0) {
          fVar6 = *in_RSI;
          fVar7 = cosf(in_XMM1_Da);
          fVar9 = in_RSI[1];
          fVar8 = sinf(in_XMM1_Da);
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb4,fVar7 * in_XMM0_Da + fVar6,
                         fVar8 * in_XMM0_Da + fVar9);
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        }
        if (0 < iVar2) {
          _PathArcToFastEx((ImDrawList *)CONCAT44(fVar4,fVar5),
                           (ImVec2 *)CONCAT17(bVar13,CONCAT16(bVar12,in_stack_ffffffffffffffb8)),
                           in_stack_ffffffffffffffb4,(int)in_stack_ffffffffffffffb0,
                           (int)in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        }
        if ((bVar12 & 1) != 0) {
          fVar4 = *in_RSI;
          fVar5 = cosf(in_XMM2_Da);
          fVar6 = fVar5 * in_XMM0_Da + fVar4;
          fVar5 = in_RSI[1];
          fVar9 = sinf(in_XMM2_Da);
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffac,fVar6,fVar9 * in_XMM0_Da + fVar5);
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)CONCAT44(fVar6,fVar5),
                     (ImVec2 *)CONCAT44(fVar4,in_stack_ffffffffffffff58));
        }
      }
    }
    else {
      _PathArcToN((ImDrawList *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI
                  ,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                  in_stack_ffffffffffffff88);
    }
  }
  else {
    ImVector<ImVec2>::push_back
              ((ImVector<ImVec2> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius < 0.5f)
    {
        _Path.push_back(center);
        return;
    }

    if (num_segments > 0)
    {
        _PathArcToN(center, radius, a_min, a_max, num_segments);
        return;
    }

    // Automatic segment count
    if (radius <= _Data->ArcFastRadiusCutoff)
    {
        const bool a_is_reverse = a_max < a_min;

        // We are going to use precomputed values for mid samples.
        // Determine first and last sample in lookup table that belong to the arc.
        const float a_min_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_min / (IM_PI * 2.0f);
        const float a_max_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_max / (IM_PI * 2.0f);

        const int a_min_sample = a_is_reverse ? (int)ImFloor(a_min_sample_f) : (int)ImCeil(a_min_sample_f);
        const int a_max_sample = a_is_reverse ? (int)ImCeil(a_max_sample_f) : (int)ImFloor(a_max_sample_f);
        const int a_mid_samples = a_is_reverse ? ImMax(a_min_sample - a_max_sample, 0) : ImMax(a_max_sample - a_min_sample, 0);

        const float a_min_segment_angle = a_min_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const float a_max_segment_angle = a_max_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const bool a_emit_start = ImAbs(a_min_segment_angle - a_min) >= 1e-5f;
        const bool a_emit_end = ImAbs(a_max - a_max_segment_angle) >= 1e-5f;

        _Path.reserve(_Path.Size + (a_mid_samples + 1 + (a_emit_start ? 1 : 0) + (a_emit_end ? 1 : 0)));
        if (a_emit_start)
            _Path.push_back(ImVec2(center.x + ImCos(a_min) * radius, center.y + ImSin(a_min) * radius));
        if (a_mid_samples > 0)
            _PathArcToFastEx(center, radius, a_min_sample, a_max_sample, 0);
        if (a_emit_end)
            _Path.push_back(ImVec2(center.x + ImCos(a_max) * radius, center.y + ImSin(a_max) * radius));
    }
    else
    {
        const float arc_length = ImAbs(a_max - a_min);
        const int circle_segment_count = _CalcCircleAutoSegmentCount(radius);
        const int arc_segment_count = ImMax((int)ImCeil(circle_segment_count * arc_length / (IM_PI * 2.0f)), (int)(2.0f * IM_PI / arc_length));
        _PathArcToN(center, radius, a_min, a_max, arc_segment_count);
    }
}